

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdapistd.c
# Opt level: O0

void jpeg_crop_scanline(j_decompress_ptr cinfo,JDIMENSION *xoffset,JDIMENSION *width)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  int *in_RDX;
  uint *in_RSI;
  long *in_RDI;
  j_decompress_ptr unaff_retaddr;
  int hsf;
  jpeg_component_info *compptr;
  boolean reinit_upsampler;
  JDIMENSION input_xoffset;
  int orig_downsampled_width;
  int align;
  int ci;
  int local_40;
  long local_38;
  uint local_20;
  int local_1c;
  
  bVar3 = false;
  if ((*(int *)((long)in_RDI + 0x24) != 0xcd) || ((int)in_RDI[0x15] != 0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x14;
    *(undefined4 *)(*in_RDI + 0x2c) = *(undefined4 *)((long)in_RDI + 0x24);
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((in_RSI == (uint *)0x0) || (in_RDX == (int *)0x0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x7c;
    (**(code **)*in_RDI)(in_RDI);
  }
  if ((*in_RDX == 0) || (*(uint *)(in_RDI + 0x11) < *in_RSI + *in_RDX)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x46;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*in_RDX != (int)in_RDI[0x11]) {
    if (((int)in_RDI[0x36] == 1) && ((int)in_RDI[7] == 1)) {
      local_20 = *(uint *)(in_RDI + 0x34);
    }
    else {
      local_20 = (int)in_RDI[0x34] * (int)in_RDI[0x33];
    }
    uVar1 = *in_RSI;
    *in_RSI = (uVar1 / local_20) * local_20;
    *in_RDX = (*in_RDX + uVar1) - *in_RSI;
    *(int *)(in_RDI + 0x11) = *in_RDX;
    *(int *)(in_RDI[0x44] + 0x14) = (int)((long)(ulong)*in_RSI / (long)(int)local_20);
    lVar4 = jdiv_round_up((ulong)(*in_RSI + (int)in_RDI[0x11]),(long)(int)local_20);
    *(int *)(in_RDI[0x44] + 0x18) = (int)lVar4 + -1;
    local_1c = 0;
    local_38 = in_RDI[0x26];
    for (; local_1c < (int)in_RDI[7]; local_1c = local_1c + 1) {
      if (((int)in_RDI[0x36] == 1) && ((int)in_RDI[7] == 1)) {
        local_40 = 1;
      }
      else {
        local_40 = *(int *)(local_38 + 8);
      }
      iVar2 = *(int *)(local_38 + 0x28);
      lVar4 = jdiv_round_up((ulong)(uint)((int)in_RDI[0x11] * *(int *)(local_38 + 8)),
                            (long)(int)in_RDI[0x33]);
      *(int *)(local_38 + 0x28) = (int)lVar4;
      if ((*(uint *)(local_38 + 0x28) < 2) && (1 < iVar2)) {
        bVar3 = true;
      }
      *(int *)(in_RDI[0x44] + 0x1c + (long)local_1c * 4) =
           (int)((long)(ulong)(*in_RSI * local_40) / (long)(int)local_20);
      lVar4 = jdiv_round_up((ulong)((*in_RSI + (int)in_RDI[0x11]) * local_40),(long)(int)local_20);
      *(int *)(in_RDI[0x44] + 0x44 + (long)local_1c * 4) = (int)lVar4 + -1;
      local_38 = local_38 + 0x60;
    }
    if (bVar3) {
      *(undefined4 *)(in_RDI[0x44] + 0x6c) = 1;
      jinit_upsampler(unaff_retaddr);
      *(undefined4 *)(in_RDI[0x44] + 0x6c) = 0;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jpeg_crop_scanline(j_decompress_ptr cinfo, JDIMENSION *xoffset,
                   JDIMENSION *width)
{
  int ci, align, orig_downsampled_width;
  JDIMENSION input_xoffset;
  boolean reinit_upsampler = FALSE;
  jpeg_component_info *compptr;

  if (cinfo->global_state != DSTATE_SCANNING || cinfo->output_scanline != 0)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  if (!xoffset || !width)
    ERREXIT(cinfo, JERR_BAD_CROP_SPEC);

  /* xoffset and width must fall within the output image dimensions. */
  if (*width == 0 || *xoffset + *width > cinfo->output_width)
    ERREXIT(cinfo, JERR_WIDTH_OVERFLOW);

  /* No need to do anything if the caller wants the entire width. */
  if (*width == cinfo->output_width)
    return;

  /* Ensuring the proper alignment of xoffset is tricky.  At minimum, it
   * must align with an MCU boundary, because:
   *
   *   (1) The IDCT is performed in blocks, and it is not feasible to modify
   *       the algorithm so that it can transform partial blocks.
   *   (2) Because of the SIMD extensions, any input buffer passed to the
   *       upsampling and color conversion routines must be aligned to the
   *       SIMD word size (for instance, 128-bit in the case of SSE2.)  The
   *       easiest way to accomplish this without copying data is to ensure
   *       that upsampling and color conversion begin at the start of the
   *       first MCU column that will be inverse transformed.
   *
   * In practice, we actually impose a stricter alignment requirement.  We
   * require that xoffset be a multiple of the maximum MCU column width of all
   * of the components (the "iMCU column width.")  This is to simplify the
   * single-pass decompression case, allowing us to use the same MCU column
   * width for all of the components.
   */
  if (cinfo->comps_in_scan == 1 && cinfo->num_components == 1)
    align = cinfo->_min_DCT_scaled_size;
  else
    align = cinfo->_min_DCT_scaled_size * cinfo->max_h_samp_factor;

  /* Adjust xoffset to the nearest iMCU boundary <= the requested value */
  input_xoffset = *xoffset;
  *xoffset = (input_xoffset / align) * align;

  /* Adjust the width so that the right edge of the output image is as
   * requested (only the left edge is altered.)  It is important that calling
   * programs check this value after this function returns, so that they can
   * allocate an output buffer with the appropriate size.
   */
  *width = *width + input_xoffset - *xoffset;
  cinfo->output_width = *width;

  /* Set the first and last iMCU columns that we must decompress.  These values
   * will be used in single-scan decompressions.
   */
  cinfo->master->first_iMCU_col = (JDIMENSION)(long)(*xoffset) / (long)align;
  cinfo->master->last_iMCU_col =
    (JDIMENSION)jdiv_round_up((long)(*xoffset + cinfo->output_width),
                              (long)align) - 1;

  for (ci = 0, compptr = cinfo->comp_info; ci < cinfo->num_components;
       ci++, compptr++) {
    int hsf = (cinfo->comps_in_scan == 1 && cinfo->num_components == 1) ?
              1 : compptr->h_samp_factor;

    /* Set downsampled_width to the new output width. */
    orig_downsampled_width = compptr->downsampled_width;
    compptr->downsampled_width =
      (JDIMENSION)jdiv_round_up((long)(cinfo->output_width *
                                       compptr->h_samp_factor),
                                (long)cinfo->max_h_samp_factor);
    if (compptr->downsampled_width < 2 && orig_downsampled_width >= 2)
      reinit_upsampler = TRUE;

    /* Set the first and last iMCU columns that we must decompress.  These
     * values will be used in multi-scan decompressions.
     */
    cinfo->master->first_MCU_col[ci] =
      (JDIMENSION)(long)(*xoffset * hsf) / (long)align;
    cinfo->master->last_MCU_col[ci] =
      (JDIMENSION)jdiv_round_up((long)((*xoffset + cinfo->output_width) * hsf),
                                (long)align) - 1;
  }

  if (reinit_upsampler) {
    cinfo->master->jinit_upsampler_no_alloc = TRUE;
    jinit_upsampler(cinfo);
    cinfo->master->jinit_upsampler_no_alloc = FALSE;
  }
}